

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalArrowCollector::GetGlobalSinkState
          (PhysicalArrowCollector *this,ClientContext *context)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0xb8);
  switchD_0105dc25::default(__s,0,0xb8);
  *(undefined1 *)(__s + 1) = 1;
  __s[2] = (_func_int *)0x0;
  __s[3] = (_func_int *)0x0;
  __s[4] = (_func_int *)0x0;
  __s[5] = (_func_int *)0x0;
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[8] = (_func_int *)0x0;
  __s[9] = (_func_int *)0x0;
  *(undefined1 *)(__s + 10) = 0;
  *__s = (_func_int *)&PTR__ArrowCollectorGlobalState_024a6ba8;
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0xd] = (_func_int *)0x0;
  __s[0xe] = (_func_int *)0x0;
  __s[0xf] = (_func_int *)0x0;
  __s[0x10] = (_func_int *)0x0;
  __s[0x11] = (_func_int *)0x0;
  __s[0x12] = (_func_int *)0x0;
  __s[0x13] = (_func_int *)0x0;
  __s[0x14] = (_func_int *)0x0;
  __s[0x15] = (_func_int *)0x0;
  __s[0x16] = (_func_int *)0x0;
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator = __s;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalArrowCollector::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<ArrowCollectorGlobalState>();
}